

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroupCommand.cxx
# Opt level: O2

bool checkSingleParameterArgumentPreconditions
               (string *argument,ParsedArguments *parsedArguments,string *errorMsg)

{
  bool bVar1;
  const_iterator cVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __return_storage_ptr__ = &bStack_58;
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::find(&parsedArguments->_M_t,argument);
  bVar1 = true;
  if ((_Rb_tree_header *)cVar2._M_node != &(parsedArguments->_M_t)._M_impl.super__Rb_tree_header) {
    if (*(_Base_ptr *)(cVar2._M_node + 2) == cVar2._M_node[2]._M_parent) {
      __return_storage_ptr__ = &local_38;
      std::operator+(__return_storage_ptr__,argument," argument given without an argument.");
      std::__cxx11::string::operator=((string *)errorMsg,(string *)__return_storage_ptr__);
    }
    else {
      if ((ulong)((long)cVar2._M_node[2]._M_parent - (long)*(_Base_ptr *)(cVar2._M_node + 2)) < 0x21
         ) {
        return true;
      }
      std::operator+(&bStack_58,"too many arguments passed to ",argument);
      std::operator+(&local_38,&bStack_58,".");
      std::__cxx11::string::operator=((string *)errorMsg,(string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool checkSingleParameterArgumentPreconditions(
  const std::string& argument, const ParsedArguments& parsedArguments,
  std::string& errorMsg)
{
  auto foundArgument = parsedArguments.find(argument);
  if (foundArgument != parsedArguments.end()) {
    const std::vector<std::string>& optionArguments = foundArgument->second;

    if (optionArguments.empty()) {
      errorMsg = argument + " argument given without an argument.";
      return false;
    }
    if (optionArguments.size() > 1) {
      errorMsg = "too many arguments passed to " + argument + ".";
      return false;
    }
  }

  return true;
}